

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O2

int luabridge::detail::
    Invoke<char_const*,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<bool,void>>,1>
    ::run<char_const*(*)(char_const*,bool)>(lua_State *L,_func_char_ptr_char_ptr_bool **fn)

{
  char *str;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>,_1>
  args;
  
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>,_1>::
  ArgList(&args,L);
  str = (**fn)(args.
               super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>_>
               .hd,args.
                   super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<bool,_void>_>_>
                   .tl.hd);
  Stack<const_char_*>::push(L,str);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }